

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_entity.cxx
# Opt level: O3

void __thiscall xray_re::cse_shape::cform_read(cse_shape *this,xr_packet *packet)

{
  iterator __position;
  ulong uVar1;
  pointer psVar2;
  uchar value;
  shape_def local_78;
  
  psVar2 = (this->m_shapes).
           super__Vector_base<xray_re::shape_def,_std::allocator<xray_re::shape_def>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->m_shapes).super__Vector_base<xray_re::shape_def,_std::allocator<xray_re::shape_def>_>.
      _M_impl.super__Vector_impl_data._M_finish != psVar2) {
    (this->m_shapes).super__Vector_base<xray_re::shape_def,_std::allocator<xray_re::shape_def>_>.
    _M_impl.super__Vector_impl_data._M_finish = psVar2;
  }
  xr_packet::r_raw(packet,&local_78,1);
  uVar1 = local_78._0_8_ & 0xff;
  if (uVar1 != 0) {
    do {
      local_78.field_1._44_8_ = 0;
      local_78.field_1._52_8_ = 0;
      local_78.field_1._28_8_ = 0;
      local_78.field_1._36_8_ = 0;
      local_78.field_1._12_8_ = 0;
      local_78.field_1._20_8_ = 0;
      local_78._0_8_ = 0;
      local_78.field_1._4_8_ = 0;
      local_78.field_1._60_4_ = 0;
      __position._M_current =
           (this->m_shapes).
           super__Vector_base<xray_re::shape_def,_std::allocator<xray_re::shape_def>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->m_shapes).
          super__Vector_base<xray_re::shape_def,_std::allocator<xray_re::shape_def>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<xray_re::shape_def,_std::allocator<xray_re::shape_def>_>::
        _M_realloc_insert<xray_re::shape_def>(&this->m_shapes,__position,&local_78);
        psVar2 = (this->m_shapes).
                 super__Vector_base<xray_re::shape_def,_std::allocator<xray_re::shape_def>_>._M_impl
                 .super__Vector_impl_data._M_finish;
      }
      else {
        *(undefined8 *)((long)&(__position._M_current)->field_1 + 0x2c) = 0;
        *(undefined8 *)((long)&(__position._M_current)->field_1 + 0x34) = 0;
        *(undefined8 *)((long)&(__position._M_current)->field_1 + 0x1c) = 0;
        *(undefined8 *)((long)&(__position._M_current)->field_1 + 0x24) = 0;
        *(undefined8 *)((long)&(__position._M_current)->field_1 + 0xc) = 0;
        *(undefined8 *)((long)&(__position._M_current)->field_1 + 0x14) = 0;
        *(undefined8 *)__position._M_current = 0;
        *(undefined8 *)((long)&(__position._M_current)->field_1 + 4) = 0;
        *(undefined4 *)((long)&(__position._M_current)->field_1 + 0x3c) = 0;
        psVar2 = (this->m_shapes).
                 super__Vector_base<xray_re::shape_def,_std::allocator<xray_re::shape_def>_>._M_impl
                 .super__Vector_impl_data._M_finish + 1;
        (this->m_shapes).super__Vector_base<xray_re::shape_def,_std::allocator<xray_re::shape_def>_>
        ._M_impl.super__Vector_impl_data._M_finish = psVar2;
      }
      xr_packet::r_raw(packet,psVar2 + -1,1);
      if (psVar2[-1].type == '\x01') {
        xr_packet::r_matrix(packet,&psVar2[-1].field_1.box);
      }
      else {
        if (psVar2[-1].type != '\0') {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity.cxx"
                        ,0x54,"void xray_re::cse_shape::cform_read(xr_packet &)");
        }
        xr_packet::r_raw(packet,&psVar2[-1].field_1,0xc);
        xr_packet::r_raw(packet,(void *)((long)&psVar2[-1].field_1 + 0xc),4);
      }
      uVar1 = uVar1 - 1;
    } while (uVar1 != 0);
  }
  return;
}

Assistant:

void cse_shape::cform_read(xr_packet& packet)
{
	m_shapes.clear();
	for (uint_fast32_t n = packet.r_u8(); n; --n) {
		m_shapes.push_back(shape_def());
		shape_def& def = m_shapes.back();
		packet.r_u8(def.type);
		if (def.type == SHAPE_SPHERE) {
			packet.r_vec3(def.sphere.p);
			packet.r_float(def.sphere.r);
		} else if (def.type == SHAPE_BOX) {
			packet.r_matrix(def.box);
		} else {
			xr_not_expected();
		}
	}
}